

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O0

void __thiscall
NfcFilter::process3(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  anon_class_56_10_b6e50998 __unary_op;
  const_iterator pfVar1;
  const_iterator pfVar2;
  undefined8 in_RCX;
  float *in_RDI;
  anon_class_56_10_b6e50998 proc_sample;
  float z3;
  float z2;
  float z1;
  float a3;
  float a2;
  float a1;
  float b3;
  float b2;
  float b1;
  float gain;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 local_b8 [8];
  float *pfStack_b0;
  float *local_a8;
  float *pfStack_a0;
  undefined8 uStack_90;
  undefined8 local_88;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  undefined8 local_20;
  span<const_float,_18446744073709551615UL> local_10;
  
  local_80 = in_RDI[0xe];
  local_7c = in_RDI[0xf];
  local_78 = in_RDI[0x10];
  local_74 = in_RDI[0x11];
  local_70 = in_RDI[0x12];
  local_6c = in_RDI[0x13];
  local_68 = in_RDI[0x14];
  local_40 = in_RDI[0x15];
  local_44 = in_RDI[0x16];
  local_48 = in_RDI[0x17];
  local_60 = &local_40;
  local_58 = &local_44;
  local_50 = &local_48;
  local_3c = local_68;
  local_38 = local_6c;
  local_34 = local_70;
  local_30 = local_74;
  local_2c = local_78;
  local_28 = local_7c;
  local_24 = local_80;
  local_20 = in_RCX;
  pfVar1 = al::span<const_float,_18446744073709551615UL>::cbegin(&local_10);
  pfVar2 = al::span<const_float,_18446744073709551615UL>::cend(&local_10);
  memcpy(local_b8,&local_80,0x38);
  __unary_op.b2 = (float)(undefined4)local_88;
  __unary_op.b3 = (float)local_88._4_4_;
  __unary_op.gain = (float)(undefined4)uStack_90;
  __unary_op.b1 = (float)uStack_90._4_4_;
  __unary_op.a1 = (float)(int)in_stack_ffffffffffffff20;
  __unary_op.a2 = (float)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  __unary_op._24_8_ = pfVar1;
  __unary_op.z1 = pfVar2;
  __unary_op.z2 = (float *)local_20;
  __unary_op.z3 = in_RDI;
  std::
  transform<float_const*,float*,NfcFilter::process3(al::span<float_const,18446744073709551615ul>,float*)::__0>
            (pfStack_a0,local_a8,pfStack_b0,__unary_op);
  in_RDI[0x15] = local_40;
  in_RDI[0x16] = local_44;
  in_RDI[0x17] = local_48;
  return;
}

Assistant:

void NfcFilter::process3(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{third.gain};
    const float b1{third.b1};
    const float b2{third.b2};
    const float b3{third.b3};
    const float a1{third.a1};
    const float a2{third.a2};
    const float a3{third.a3};
    float z1{third.z[0]};
    float z2{third.z[1]};
    float z3{third.z[2]};
    auto proc_sample = [gain,b1,b2,b3,a1,a2,a3,&z1,&z2,&z3](const float in) noexcept -> float
    {
        float y{in*gain - a1*z1 - a2*z2};
        float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;

        y = out - a3*z3;
        out = y + b3*z3;
        z3 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    third.z[0] = z1;
    third.z[1] = z2;
    third.z[2] = z3;
}